

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

Edge * __thiscall Graph::getEdge(Graph *this,int from,int to)

{
  pointer pvVar1;
  bool bVar2;
  undefined8 *puVar3;
  size_t i;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    pvVar1 = (this->adjList).
             super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->adjList).
                       super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= uVar4)
    {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "Edge not found!";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
    bVar2 = Edge::connectsTo(*(Edge **)(*(long *)&pvVar1[from].
                                                  super__Vector_base<Edge_*,_std::allocator<Edge_*>_>
                                                  ._M_impl + uVar4 * 8),to);
    if (bVar2) break;
    uVar4 = uVar4 + 1;
  }
  return *(Edge **)(*(long *)&(this->adjList).
                              super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[from].
                              super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl +
                   uVar4 * 8);
}

Assistant:

const Edge* Graph::getEdge(int from, int to) {
  for(size_t i = 0; i < adjList.size(); i++) {
    if(adjList[from][i]->connectsTo(to)) {
      return (adjList[from][i]);
    }
  }
  throw "Edge not found!";
}